

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O3

bool __thiscall
peparse::readCString(peparse *this,bounded_buffer *buffer,uint32_t off,string *result)

{
  peparse *ppVar1;
  pointer pcVar2;
  peparse *ppVar3;
  
  if ((uint)buffer <= off) {
    return false;
  }
  ppVar3 = this + ((ulong)buffer & 0xffffffff);
  ppVar1 = (peparse *)
           std::__find_if<unsigned_char*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                     (this + off,ppVar3);
  if (ppVar1 != ppVar3) {
    pcVar2 = (result->_M_dataplus)._M_p + result->_M_string_length;
    std::__cxx11::string::_M_replace_dispatch<unsigned_char*>
              ((string *)result,pcVar2,pcVar2,this + off,ppVar1);
  }
  return ppVar1 != ppVar3;
}

Assistant:

static bool readCString(const bounded_buffer &buffer,
                        std::uint32_t off,
                        std::string &result) {
  if (off < buffer.bufLen) {
    std::uint8_t *p = buffer.buf;
    std::uint32_t n = buffer.bufLen;
    std::uint8_t *b = p + off;
    std::uint8_t *x = std::find(b, p + n, 0);

    if (x == p + n) {
      return false;
    }

    result.insert(result.end(), b, x);
    return true;
  }
  return false;
}